

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O2

uint32_t Ngram_next_words(Ngram model,uint32_t *context,uint32_t context_len,
                         uint32_t next_word_limit,NextWordResult_T *rets)

{
  uint uVar1;
  int iVar2;
  LowGram_T **ppLVar3;
  LowGram_T *pLVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  UniGram_T *pUVar7;
  void *__base;
  ulong uVar8;
  UniGram_T *pUVar9;
  long lVar10;
  size_t sVar11;
  size_t __nmemb;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  ulong local_40;
  
  if (context_len == 0) {
    return 0;
  }
  local_40 = 0;
  uVar13 = (context_len - model->ngram_order) + 1;
  if (context_len < model->ngram_order) {
    uVar13 = 0;
  }
  uVar8 = (ulong)uVar13;
  uVar12 = uVar8;
  do {
    uVar13 = (uint)uVar8;
LAB_00102f4c:
    do {
      uVar13 = uVar13 + 1;
      uVar5 = (uint32_t)local_40;
      if (context_len <= uVar12) {
        return uVar5;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      pUVar7 = model->uni_gram + context[uVar12];
      pUVar9 = model->uni_gram + (context[uVar12] + 1);
      uVar12 = uVar12 + 1;
      bVar17 = true;
      lVar10 = 0;
      while( true ) {
        uVar1 = pUVar7->next_arr_idx;
        uVar15 = (ulong)uVar1;
        if ((ulong)context_len <= (ulong)uVar13 + lVar10) break;
        ppLVar3 = model->low_grams;
        uVar6 = search_low_gram(context[(ulong)uVar13 + lVar10],ppLVar3[lVar10] + uVar15,
                                (ulong)(pUVar9->next_arr_idx - uVar1));
        if (uVar6 == 0xffffffff) goto LAB_00102f4c;
        pLVar4 = ppLVar3[lVar10 + 1];
        lVar10 = lVar10 + 1;
        pUVar7 = (UniGram_T *)&pLVar4[uVar6].next_arr_idx;
        pUVar9 = (UniGram_T *)&pLVar4[(ulong)uVar6 + 1].next_arr_idx;
        bVar17 = false;
      }
    } while (bVar17);
    uVar14 = (ulong)(pUVar9->next_arr_idx - uVar1);
    __base = malloc(uVar14 * 8);
    if ((int)lVar10 - model->ngram_order == -2) {
      __nmemb = 0;
      while (bVar17 = uVar14 != 0, uVar14 = uVar14 - 1, bVar17) {
        uVar6 = model->high_gram[uVar15].prob;
        if (uVar6 != 0xffffffff) {
          *(uint32_t *)((long)__base + __nmemb * 8) = model->high_gram[uVar15].word;
          *(uint32_t *)((long)__base + __nmemb * 8 + 4) = uVar6;
          __nmemb = __nmemb + 1;
        }
        uVar15 = uVar15 + 1;
      }
    }
    else {
      lVar16 = uVar15 << 4;
      __nmemb = 0;
      while (bVar17 = uVar14 != 0, uVar14 = uVar14 - 1, bVar17) {
        iVar2 = *(int *)((long)&model->low_grams[lVar10]->prob + lVar16);
        if (iVar2 != -1) {
          *(undefined4 *)((long)__base + __nmemb * 8) =
               *(undefined4 *)((long)&model->low_grams[lVar10]->word + lVar16);
          *(int *)((long)__base + __nmemb * 8 + 4) = iVar2;
          __nmemb = __nmemb + 1;
        }
        lVar16 = lVar16 + 0x10;
      }
    }
    qsort(__base,__nmemb,8,next_word_cmp);
    sVar11 = 0;
    while (__nmemb != sVar11) {
      rets[local_40 + sVar11 & 0xffffffff] = *(NextWordResult_T *)((long)__base + sVar11 * 8);
      sVar11 = sVar11 + 1;
      if (next_word_limit <= (int)sVar11 + uVar5) {
        free(__base);
        return next_word_limit;
      }
    }
    free(__base);
    local_40 = (ulong)(uVar5 + (int)sVar11);
  } while( true );
}

Assistant:

uint32_t Ngram_next_words(const Ngram model, const uint32_t* context, uint32_t context_len, uint32_t next_word_limit, NextWordResult_T* rets){
    if (context_len == 0) {
        return 0;
    }
    uint32_t start = (context_len >= model->ngram_order) ? (context_len - model->ngram_order + 1): 0;
    uint32_t res_num = 0;
    for (uint32_t i = start; i < context_len; i++) {
        uint32_t cur_word_id = context[i];
        uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
        uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
        uint32_t next = -1;
        uint32_t ngram_idx = 0;
        for (uint32_t j = i+1; j < context_len;j++) {
            next = search_low_gram(context[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start);
            ngram_idx+=1;
            if (next == -1) {
                break;
            }else{
                next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
                next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
            }
        }
        if (next != -1) {
            //have found
            size_t arr_size = next_word_end - next_word_start;
            size_t arr_real_size = 0;
            NextWordResult_T* word_results = malloc(sizeof(NextWordResult_T)*arr_size);
            if (ngram_idx+2 != model->ngram_order) {
                //in low gram array
                for (size_t i = 0; i < arr_size; i++) {
                    LowGram_T* gram = &model->low_grams[ngram_idx][next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {//srilm's bug
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }else{
                //in high gram array
                for (size_t i = 0; i < arr_size; i++) {
                    HighGram_T* gram = &model->high_gram[next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }
            qsort(word_results,arr_real_size, sizeof(NextWordResult_T), next_word_cmp);
            //copy to dst
            //if enough, then break
            for (size_t i = 0;i< arr_real_size;i++) {
                rets[res_num++] = word_results[i];
                if (res_num >= next_word_limit) {
                    free(word_results);
                    return next_word_limit;
                }
            }
            free(word_results);
        }
    }
    return res_num;
}